

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimeIncUpdateDeparture(SC_Man *p)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Abc_Obj_t *pObj_00;
  SC_Pair *s;
  float fVar2;
  int local_3c;
  int local_38;
  int k;
  int i;
  float E;
  Abc_Obj_t *pObj;
  SC_Pair *pDepOut;
  SC_Pair DepOut;
  Vec_Int_t *vLevel;
  SC_Man *p_local;
  
  local_38 = Vec_WecSize(p->vLevels);
  while (local_38 = local_38 + -1, -1 < local_38) {
    DepOut = (SC_Pair)Vec_WecEntry(p->vLevels,local_38);
    for (local_3c = 0; iVar1 = Vec_IntSize((Vec_Int_t *)DepOut), local_3c < iVar1;
        local_3c = local_3c + 1) {
      pNtk = p->pNtk;
      iVar1 = Vec_IntEntry((Vec_Int_t *)DepOut,local_3c);
      pObj_00 = Abc_NtkObj(pNtk,iVar1);
      if (pObj_00 != (Abc_Obj_t *)0x0) {
        s = Abc_SclObjDept(p,pObj_00);
        SC_PairMove((SC_Pair *)&pDepOut,s);
        Abc_SclDeptObj(p,pObj_00);
        iVar1 = SC_PairEqualE((SC_Pair *)&pDepOut,s,0.1);
        if (iVar1 == 0) {
          Abc_SclTimeIncAddFanins(p,pObj_00);
        }
      }
    }
  }
  fVar2 = Abc_SclReadMaxDelay(p);
  p->MaxDelay = fVar2;
  return;
}

Assistant:

static inline void Abc_SclTimeIncUpdateDeparture( SC_Man * p )
{
    Vec_Int_t * vLevel;
    SC_Pair DepOut, * pDepOut;
    Abc_Obj_t * pObj;
    float E = (float)0.1;
    int i, k;
    Vec_WecForEachLevelReverse( p->vLevels, vLevel, i )
    {
        Abc_NtkForEachObjVec( vLevel, p->pNtk, pObj, k )
        {
            pDepOut = Abc_SclObjDept( p, pObj );
            SC_PairMove( &DepOut, pDepOut );
            Abc_SclDeptObj( p, pObj );
//            if ( !SC_PairEqual(&DepOut, pDepOut) )
            if ( !SC_PairEqualE(&DepOut, pDepOut, E) )
                Abc_SclTimeIncAddFanins( p, pObj );
        }
    } 
    p->MaxDelay = Abc_SclReadMaxDelay( p );
}